

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_unittest.h
# Opt level: O3

void __thiscall
google::protobuf::internal::gtest_suite_Utf8ValidationTest_::
WriteArbitraryBytes<proto2_unittest::TestAllTypes>::~WriteArbitraryBytes
          (WriteArbitraryBytes<proto2_unittest::TestAllTypes> *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TYPED_TEST_P(Utf8ValidationTest, WriteArbitraryBytes) {
  std::string wire_buffer;
  typename TestFixture::OneBytes input;
  {
    absl::ScopedMockLog log(absl::MockLogDefault::kDisallowUnexpected);
    EXPECT_CALL(log, Log(absl::LogSeverity::kError, testing::_, testing::_))
        .Times(0);
    log.StartCapturingLogs();
    WriteMessage(this->kInvalidUTF8String, &input, &wire_buffer);
  }
}